

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_context_initializer_t *
fill_context_data(exr_context_initializer_t *__return_storage_ptr__,
                 exr_context_initializer_t *ctxtdata)

{
  ulong uVar1;
  exr_memory_allocation_func_t p_Var2;
  void *pvVar3;
  exr_query_size_func_ptr_t p_Var4;
  exr_destroy_stream_func_ptr_t p_Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  __return_storage_ptr__->zip_level = 0;
  __return_storage_ptr__->dwa_quality = 0.0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->pad[0] = '\0';
  __return_storage_ptr__->pad[1] = '\0';
  __return_storage_ptr__->pad[2] = '\0';
  __return_storage_ptr__->pad[3] = '\0';
  __return_storage_ptr__->max_image_width = 0;
  __return_storage_ptr__->max_image_height = 0;
  __return_storage_ptr__->max_tile_width = 0;
  __return_storage_ptr__->max_tile_height = 0;
  __return_storage_ptr__->write_fn = (exr_write_func_ptr_t)0x0;
  __return_storage_ptr__->destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  __return_storage_ptr__->read_fn = (exr_read_func_ptr_t)0x0;
  __return_storage_ptr__->size_fn = (exr_query_size_func_ptr_t)0x0;
  __return_storage_ptr__->free_fn = (exr_memory_free_func_t)0x0;
  __return_storage_ptr__->user_data = (void *)0x0;
  __return_storage_ptr__->error_handler_fn = (exr_error_handler_cb_t)0x0;
  __return_storage_ptr__->alloc_fn = (exr_memory_allocation_func_t)0x0;
  __return_storage_ptr__->size = 0x68;
  __return_storage_ptr__->zip_level = -2;
  __return_storage_ptr__->dwa_quality = -1.0;
  if (ctxtdata != (exr_context_initializer_t *)0x0) {
    p_Var2 = ctxtdata->alloc_fn;
    __return_storage_ptr__->error_handler_fn = ctxtdata->error_handler_fn;
    __return_storage_ptr__->alloc_fn = p_Var2;
    pvVar3 = ctxtdata->user_data;
    __return_storage_ptr__->free_fn = ctxtdata->free_fn;
    __return_storage_ptr__->user_data = pvVar3;
    p_Var4 = ctxtdata->size_fn;
    __return_storage_ptr__->read_fn = ctxtdata->read_fn;
    __return_storage_ptr__->size_fn = p_Var4;
    p_Var5 = ctxtdata->destroy_fn;
    __return_storage_ptr__->write_fn = ctxtdata->write_fn;
    __return_storage_ptr__->destroy_fn = p_Var5;
    iVar6 = ctxtdata->max_image_height;
    iVar7 = ctxtdata->max_tile_width;
    iVar8 = ctxtdata->max_tile_height;
    __return_storage_ptr__->max_image_width = ctxtdata->max_image_width;
    __return_storage_ptr__->max_image_height = iVar6;
    __return_storage_ptr__->max_tile_width = iVar7;
    __return_storage_ptr__->max_tile_height = iVar8;
    uVar1 = ctxtdata->size;
    if (0x5f < uVar1) {
      __return_storage_ptr__->zip_level = ctxtdata->zip_level;
      __return_storage_ptr__->dwa_quality = ctxtdata->dwa_quality;
      if (0x67 < uVar1) {
        __return_storage_ptr__->flags = ctxtdata->flags;
      }
    }
  }
  internal_exr_update_default_handlers(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static inline exr_context_initializer_t
fill_context_data (const exr_context_initializer_t* ctxtdata)
{
    exr_context_initializer_t inits = EXR_DEFAULT_CONTEXT_INITIALIZER;
    if (ctxtdata)
    {
        inits.error_handler_fn = ctxtdata->error_handler_fn;
        inits.alloc_fn         = ctxtdata->alloc_fn;
        inits.free_fn          = ctxtdata->free_fn;
        inits.user_data        = ctxtdata->user_data;
        inits.read_fn          = ctxtdata->read_fn;
        inits.size_fn          = ctxtdata->size_fn;
        inits.write_fn         = ctxtdata->write_fn;
        inits.destroy_fn       = ctxtdata->destroy_fn;
        inits.max_image_width  = ctxtdata->max_image_width;
        inits.max_image_height = ctxtdata->max_image_height;
        inits.max_tile_width   = ctxtdata->max_tile_width;
        inits.max_tile_height  = ctxtdata->max_tile_height;
        if (ctxtdata->size >= sizeof (struct _exr_context_initializer_v2))
        {
            inits.zip_level   = ctxtdata->zip_level;
            inits.dwa_quality = ctxtdata->dwa_quality;
        }
        if (ctxtdata->size >= sizeof (struct _exr_context_initializer_v3))
        {
            inits.flags = ctxtdata->flags;
        }
    }

    internal_exr_update_default_handlers (&inits);
    return inits;
}